

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O0

IdentifierRole __thiscall
psy::C::Parser::guessRoleOfIdentifier(Parser *this,DeclarationContext declCtx)

{
  SyntaxKind SVar1;
  SyntaxToken *pSVar2;
  bool local_4d;
  bool local_45;
  int local_30;
  int local_2c;
  int check_1;
  int brackets;
  int check;
  int parens;
  int LA;
  DeclarationContext declCtx_local;
  Parser *this_local;
  
  check = 2;
  pSVar2 = peek(this,2);
  SVar1 = SyntaxToken::kind(pSVar2);
  switch(SVar1) {
  case IdentifierToken:
    this_local._7_1_ = true;
    break;
  default:
    this_local._7_1_ = false;
    break;
  case OpenBracketToken:
    if (declCtx == Parameter) {
      this_local._7_1_ = true;
    }
    else {
      local_2c = 1;
      local_30 = 0;
      while( true ) {
        pSVar2 = peek(this,check + 1);
        SVar1 = SyntaxToken::kind(pSVar2);
        if (SVar1 == EndOfFile) break;
        if (SVar1 == IdentifierToken) {
          if (local_30 == 0) {
            local_30 = -1;
          }
          else {
            local_30 = 1;
          }
          check = check + 1;
        }
        else if (SVar1 == OpenBracketToken) {
          local_2c = local_2c + 1;
          check = check + 1;
        }
        else if (SVar1 == CloseBracketToken) {
          local_2c = local_2c + -1;
          if (local_2c == 0) {
            return local_30 == -1;
          }
          check = check + 1;
        }
        else {
          if (SVar1 == SemicolonToken) break;
          if (SVar1 == AsteriskToken) {
            check = check + 1;
          }
          else {
            local_30 = local_30 + 1;
            check = check + 1;
          }
        }
      }
      this_local._7_1_ = false;
    }
    break;
  case CloseBracketToken:
    pSVar2 = peek(this,3);
    SVar1 = SyntaxToken::kind(pSVar2);
    if (SVar1 == OpenBraceToken) {
      local_4d = false;
    }
    else {
      local_4d = (this->isWithinKandRFuncDef_ & 1U) == 0;
    }
    this_local._7_1_ = local_4d;
    break;
  case OpenParenToken:
    if (declCtx == Parameter) {
      this_local._7_1_ = true;
    }
    else {
      brackets = 1;
      check_1 = 0;
      while( true ) {
        pSVar2 = peek(this,check + 1);
        SVar1 = SyntaxToken::kind(pSVar2);
        if (SVar1 == EndOfFile) break;
        if (SVar1 == IdentifierToken) {
          if (check_1 == 0) {
            check_1 = -1;
          }
          else {
            check_1 = 1;
          }
          check = check + 1;
        }
        else if (SVar1 == OpenParenToken) {
          brackets = brackets + 1;
          check = check + 1;
        }
        else if (SVar1 == CloseParenToken) {
          brackets = brackets + -1;
          if (brackets == 0) {
            return check_1 == -1;
          }
          check = check + 1;
        }
        else {
          if (SVar1 == SemicolonToken) break;
          if (SVar1 == AsteriskToken) {
            check = check + 1;
          }
          else {
            check_1 = check_1 + 1;
            check = check + 1;
          }
        }
      }
      this_local._7_1_ = false;
    }
    break;
  case CloseParenToken:
    pSVar2 = peek(this,3);
    SVar1 = SyntaxToken::kind(pSVar2);
    if (SVar1 == OpenBraceToken) {
      local_45 = false;
    }
    else {
      local_45 = (this->isWithinKandRFuncDef_ & 1U) == 0;
    }
    this_local._7_1_ = local_45;
    break;
  case Keyword_auto:
  case Keyword_extern:
  case Keyword_register:
  case Keyword_static:
  case Keyword_typedef:
  case Keyword__Thread_local:
  case Keyword_ExtGNU___thread:
    this_local._7_1_ = true;
    break;
  case Keyword_char:
  case Keyword_double:
  case Keyword_enum:
  case Keyword_float:
  case Keyword_int:
  case Keyword_long:
  case Keyword_short:
  case KeywordAlias___signed:
  case Keyword_struct:
  case Keyword_union:
  case Keyword_unsigned:
  case Keyword_void:
  case Keyword_Ext_wchar_t:
  case KeywordAlias_Bool:
  case Keyword__Complex:
  case Keyword_Ext_char16_t:
  case Keyword_Ext_char32_t:
  case Keyword_ExtGNU___complex__:
    this_local._7_1_ = false;
    break;
  case KeywordAlias___const:
  case KeywordAlias___restrict:
  case ENDof_KeywordOrPunctuatorToken:
  case Keyword__Atomic:
    this_local._7_1_ = true;
    break;
  case KeywordAlias___inline:
  case Keyword__Noreturn:
    this_local._7_1_ = true;
    break;
  case AsteriskToken:
    this_local._7_1_ = true;
    break;
  case CommaToken:
    this_local._7_1_ = (this->isWithinKandRFuncDef_ & 1U) == 0;
    break;
  case KeywordAlias___alignas:
    this_local._7_1_ = true;
    break;
  case KeywordAlias___attribute:
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

Parser::IdentifierRole Parser::guessRoleOfIdentifier(DeclarationContext declCtx) const
{
    auto LA = 2;
    while (true) {
        switch (peek(LA).kind()) {
            case SyntaxKind::IdentifierToken:
                return IdentifierRole::TypedefName;

            // type-specifier
            case SyntaxKind::Keyword_void:
            case SyntaxKind::Keyword_char:
            case SyntaxKind::Keyword_short:
            case SyntaxKind::Keyword_int:
            case SyntaxKind::Keyword_long:
            case SyntaxKind::Keyword_float:
            case SyntaxKind::Keyword_double:
            case SyntaxKind::Keyword__Bool:
            case SyntaxKind::Keyword__Complex:
            case SyntaxKind::Keyword_signed:
            case SyntaxKind::Keyword_unsigned:
            case SyntaxKind::Keyword_Ext_char16_t:
            case SyntaxKind::Keyword_Ext_char32_t:
            case SyntaxKind::Keyword_Ext_wchar_t:
            case SyntaxKind::Keyword_struct:
            case SyntaxKind::Keyword_union:
            case SyntaxKind::Keyword_enum:
            case SyntaxKind::Keyword_ExtGNU___complex__:
                return IdentifierRole::Declarator;

            // storage-class-specifier
            case SyntaxKind::Keyword_typedef:
            case SyntaxKind::Keyword_extern:
            case SyntaxKind::Keyword_static:
            case SyntaxKind::Keyword_auto:
            case SyntaxKind::Keyword_register:
            case SyntaxKind::Keyword__Thread_local:
            case SyntaxKind::Keyword_ExtGNU___thread:
                return IdentifierRole::TypedefName;

            // type-qualifier
            case SyntaxKind::Keyword_const:
            case SyntaxKind::Keyword_volatile:
            case SyntaxKind::Keyword_restrict:
            case SyntaxKind::Keyword__Atomic:
                return IdentifierRole::TypedefName;

            // function-specifier
            case SyntaxKind::Keyword_inline:
            case SyntaxKind::Keyword__Noreturn:
                return IdentifierRole::TypedefName;

            // alignment-specifier
            case SyntaxKind::Keyword__Alignas:
                return IdentifierRole::TypedefName;

            // attribute-specifier
            case SyntaxKind::Keyword_ExtGNU___attribute__:
                return IdentifierRole::TypedefName;

            // pointer-declarator
            case SyntaxKind::AsteriskToken:
                return IdentifierRole::TypedefName;

            case SyntaxKind::OpenParenToken: {
                if (declCtx == DeclarationContext::Parameter)
                    return IdentifierRole::TypedefName;
                auto parens = 1;
                auto check = 0;
                while (true) {
                    switch (peek(LA + 1).kind()) {
                        case SyntaxKind::OpenParenToken:
                            ++parens;
                            ++LA;
                            continue;
                        case SyntaxKind::CloseParenToken:
                            --parens;
                            if (!parens)
                                break;
                            ++LA;
                            continue;
                        case SyntaxKind::IdentifierToken:
                            if (check == 0)
                                check = -1;
                            else
                                check = 1;
                            ++LA;
                            continue;
                        case SyntaxKind::AsteriskToken:
                            ++LA;
                            continue;
                        case SyntaxKind::SemicolonToken:
                        case SyntaxKind::EndOfFile:
                            return IdentifierRole::Declarator;
                        default:
                            ++check;
                            ++LA;
                            continue;
                    }
                    break;
                }
                return check == -1
                        ? IdentifierRole::TypedefName
                        : IdentifierRole::Declarator;
            }

            case SyntaxKind::CloseParenToken:
                return peek(LA + 1).kind() == SyntaxKind::OpenBraceToken
                        ? IdentifierRole::Declarator
                        : isWithinKandRFuncDef_
                            ? IdentifierRole::Declarator
                            : IdentifierRole::TypedefName;

            case SyntaxKind::OpenBracketToken: {
                if (declCtx == DeclarationContext::Parameter)
                    return IdentifierRole::TypedefName;
                auto brackets = 1;
                auto check = 0;
                while (true) {
                    switch (peek(LA + 1).kind()) {
                        case SyntaxKind::OpenBracketToken:
                            ++brackets;
                            ++LA;
                            continue;
                        case SyntaxKind::CloseBracketToken:
                            --brackets;
                            if (!brackets)
                                break;
                            ++LA;
                            continue;
                        case SyntaxKind::IdentifierToken:
                            if (check == 0)
                                check = -1;
                            else
                                check = 1;
                            ++LA;
                            continue;
                        case SyntaxKind::AsteriskToken:
                            ++LA;
                            continue;
                        case SyntaxKind::SemicolonToken:
                        case SyntaxKind::EndOfFile:
                            return IdentifierRole::Declarator;
                        default:
                            ++check;
                            ++LA;
                            continue;
                    }
                    break;
                }
                return check == -1
                        ? IdentifierRole::TypedefName
                        : IdentifierRole::Declarator;
            }

            case SyntaxKind::CloseBracketToken:
                return peek(LA + 1).kind() == SyntaxKind::OpenBraceToken
                        ? IdentifierRole::Declarator
                        : isWithinKandRFuncDef_
                            ? IdentifierRole::Declarator
                            : IdentifierRole::TypedefName;

            case SyntaxKind::CommaToken:
                return isWithinKandRFuncDef_
                        ? IdentifierRole::Declarator
                        : IdentifierRole::TypedefName;

            default:
                return IdentifierRole::Declarator;
        }
    }
}